

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pubkey_to_pedersen_commitment
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,secp256k1_pubkey *pubkey
              )

{
  secp256k1_ge P;
  secp256k1_ge local_68;
  
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_pubkey_to_pedersen_commitment_cold_2();
  }
  else {
    commit->data[0x30] = '\0';
    commit->data[0x31] = '\0';
    commit->data[0x32] = '\0';
    commit->data[0x33] = '\0';
    commit->data[0x34] = '\0';
    commit->data[0x35] = '\0';
    commit->data[0x36] = '\0';
    commit->data[0x37] = '\0';
    commit->data[0x38] = '\0';
    commit->data[0x39] = '\0';
    commit->data[0x3a] = '\0';
    commit->data[0x3b] = '\0';
    commit->data[0x3c] = '\0';
    commit->data[0x3d] = '\0';
    commit->data[0x3e] = '\0';
    commit->data[0x3f] = '\0';
    commit->data[0x20] = '\0';
    commit->data[0x21] = '\0';
    commit->data[0x22] = '\0';
    commit->data[0x23] = '\0';
    commit->data[0x24] = '\0';
    commit->data[0x25] = '\0';
    commit->data[0x26] = '\0';
    commit->data[0x27] = '\0';
    commit->data[0x28] = '\0';
    commit->data[0x29] = '\0';
    commit->data[0x2a] = '\0';
    commit->data[0x2b] = '\0';
    commit->data[0x2c] = '\0';
    commit->data[0x2d] = '\0';
    commit->data[0x2e] = '\0';
    commit->data[0x2f] = '\0';
    commit->data[0x10] = '\0';
    commit->data[0x11] = '\0';
    commit->data[0x12] = '\0';
    commit->data[0x13] = '\0';
    commit->data[0x14] = '\0';
    commit->data[0x15] = '\0';
    commit->data[0x16] = '\0';
    commit->data[0x17] = '\0';
    commit->data[0x18] = '\0';
    commit->data[0x19] = '\0';
    commit->data[0x1a] = '\0';
    commit->data[0x1b] = '\0';
    commit->data[0x1c] = '\0';
    commit->data[0x1d] = '\0';
    commit->data[0x1e] = '\0';
    commit->data[0x1f] = '\0';
    commit->data[0] = '\0';
    commit->data[1] = '\0';
    commit->data[2] = '\0';
    commit->data[3] = '\0';
    commit->data[4] = '\0';
    commit->data[5] = '\0';
    commit->data[6] = '\0';
    commit->data[7] = '\0';
    commit->data[8] = '\0';
    commit->data[9] = '\0';
    commit->data[10] = '\0';
    commit->data[0xb] = '\0';
    commit->data[0xc] = '\0';
    commit->data[0xd] = '\0';
    commit->data[0xe] = '\0';
    commit->data[0xf] = '\0';
    if (pubkey != (secp256k1_pubkey *)0x0) {
      secp256k1_pubkey_load(ctx,&local_68,pubkey);
      secp256k1_pedersen_commitment_save(commit,&local_68);
      return 1;
    }
    secp256k1_pubkey_to_pedersen_commitment_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_pubkey_to_pedersen_commitment(const secp256k1_context* ctx, secp256k1_pedersen_commitment* commit, const secp256k1_pubkey* pubkey)  {
    secp256k1_ge P;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    memset(commit, 0, sizeof(*commit));
    ARG_CHECK(pubkey != NULL);

    secp256k1_pubkey_load(ctx, &P, pubkey);
    secp256k1_pedersen_commitment_save(commit, &P);

    secp256k1_ge_clear(&P);
    return 1;
}